

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O1

void X86_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  uint8_t *puVar1;
  cs_mode cVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar7;
  uint8_t uVar8;
  unsigned_short uVar9;
  uint16_t uVar10;
  uint uVar11;
  uint16_t uVar12;
  cs_detail *pcVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar9 = insn_find(insns,0x2127,id,&h->insn_cache);
  if (uVar9 == 0) {
    return;
  }
  insn->id = (uint)insns[uVar9].mapid;
  if (h->detail == CS_OPT_OFF) {
    return;
  }
  pcVar13 = insn->detail;
  *(undefined8 *)(pcVar13->regs_read + 8) = *(undefined8 *)(insns[uVar9].regs_use + 8);
  uVar4 = *(undefined8 *)(insns[uVar9].regs_use + 4);
  *(undefined8 *)pcVar13->regs_read = *(undefined8 *)insns[uVar9].regs_use;
  *(undefined8 *)(pcVar13->regs_read + 4) = uVar4;
  uVar11 = count_positive(insns[uVar9].regs_use);
  pcVar13 = insn->detail;
  pcVar13->regs_read_count = (uint8_t)uVar11;
  if (id == 0x95a) {
    if (h->mode == CS_MODE_64) {
LAB_002438c7:
      *(undefined8 *)(pcVar13->regs_write + 0x10) = *(undefined8 *)(insns[uVar9].regs_mod + 0x10);
      uVar4 = *(undefined8 *)insns[uVar9].regs_mod;
      uVar5 = *(undefined8 *)(insns[uVar9].regs_mod + 4);
      uVar6 = *(undefined8 *)(insns[uVar9].regs_mod + 0xc);
      *(undefined8 *)(pcVar13->regs_write + 8) = *(undefined8 *)(insns[uVar9].regs_mod + 8);
      *(undefined8 *)(pcVar13->regs_write + 0xc) = uVar6;
      *(undefined8 *)pcVar13->regs_write = uVar4;
      *(undefined8 *)(pcVar13->regs_write + 4) = uVar5;
      goto LAB_00243908;
    }
    pcVar13->regs_write[0] = 0x13;
    pcVar13->regs_write[1] = 0x18;
    uVar8 = '\x02';
  }
  else if (id == 0x95b) {
    if (h->mode == CS_MODE_64) goto LAB_002438c7;
    pcVar13->regs_write[0] = 0x13;
    pcVar13->regs_write[1] = 0x16;
    pcVar13->regs_write[2] = 0x18;
    uVar8 = '\x03';
  }
  else {
    *(undefined8 *)(pcVar13->regs_write + 0x10) = *(undefined8 *)(insns[uVar9].regs_mod + 0x10);
    uVar4 = *(undefined8 *)insns[uVar9].regs_mod;
    uVar5 = *(undefined8 *)(insns[uVar9].regs_mod + 4);
    uVar6 = *(undefined8 *)(insns[uVar9].regs_mod + 0xc);
    *(undefined8 *)(pcVar13->regs_write + 8) = *(undefined8 *)(insns[uVar9].regs_mod + 8);
    *(undefined8 *)(pcVar13->regs_write + 0xc) = uVar6;
    *(undefined8 *)pcVar13->regs_write = uVar4;
    *(undefined8 *)(pcVar13->regs_write + 4) = uVar5;
LAB_00243908:
    uVar11 = count_positive(insns[uVar9].regs_mod);
    uVar8 = (uint8_t)uVar11;
    pcVar13 = insn->detail;
  }
  pcVar13->regs_write_count = uVar8;
  uVar11 = insn->id;
  if ((int)uVar11 < 0x1d6) {
    if (0x14e < (int)uVar11) {
      if (uVar11 - 0x14f < 4) {
        if (h->mode == CS_MODE_64) {
          pcVar13 = insn->detail;
          if ((ulong)pcVar13->regs_read_count != 0) {
            uVar14 = 0;
            do {
              if (pcVar13->regs_read[uVar14] == 0x1d) {
                pcVar13->regs_read[uVar14] = 0x2b;
                break;
              }
              uVar14 = uVar14 + 1;
            } while (pcVar13->regs_read_count != uVar14);
          }
          if ((ulong)pcVar13->regs_write_count != 0) {
            uVar14 = 0;
            do {
              if (pcVar13->regs_write[uVar14] == 0x1d) {
                pcVar13->regs_write[uVar14] = 0x2b;
                break;
              }
              uVar14 = uVar14 + 1;
            } while (pcVar13->regs_write_count != uVar14);
          }
        }
        else if (h->mode == CS_MODE_16) {
          pcVar13 = insn->detail;
          if ((ulong)pcVar13->regs_read_count != 0) {
            uVar14 = 0;
            do {
              if (pcVar13->regs_read[uVar14] == 0x1d) {
                pcVar13->regs_read[uVar14] = 0x2d;
                break;
              }
              uVar14 = uVar14 + 1;
            } while (pcVar13->regs_read_count != uVar14);
          }
          if ((ulong)pcVar13->regs_write_count != 0) {
            uVar14 = 0;
            do {
              if (pcVar13->regs_write[uVar14] == 0x1d) {
                pcVar13->regs_write[uVar14] = 0x2d;
                break;
              }
              uVar14 = uVar14 + 1;
            } while (pcVar13->regs_write_count != uVar14);
          }
        }
        goto LAB_00243d4d;
      }
      if (2 < uVar11 - 0x153) goto LAB_00243d4d;
      cVar2 = h->mode;
      if (cVar2 == CS_MODE_16) {
        uVar12 = 0xc;
LAB_00243c5b:
        pcVar13 = insn->detail;
        pcVar13->regs_read[0] = uVar12;
        pcVar13->regs_read_count = '\x01';
        pcVar13->regs_write[0] = uVar12;
        pcVar13->regs_write_count = '\x01';
      }
      else {
        if (cVar2 == CS_MODE_64) {
          uVar12 = 0x26;
          goto LAB_00243c5b;
        }
        if (cVar2 == CS_MODE_32) {
          uVar12 = 0x16;
          goto LAB_00243c5b;
        }
      }
      if (uVar11 != 0x153) {
        pcVar13 = insn->detail;
        pcVar13->regs_read[1] = 0x19;
        pcVar13->regs_read_count = '\x02';
      }
      goto LAB_00243d4d;
    }
    if (2 < uVar11 - 0x60) {
      if (uVar11 == 0x93) {
        pcVar13 = insn->detail;
        uVar12 = 0x2c;
        if (h->mode == CS_MODE_32) {
          uVar12 = 0x1e;
        }
        uVar10 = 0x2f;
        if (h->mode != CS_MODE_16) {
          uVar10 = uVar12;
        }
        pcVar13->regs_write[0] = uVar10;
        pcVar13->regs_read[0] = uVar10;
        pcVar13 = insn->detail;
        pcVar13->regs_write_count = '\x01';
        pcVar13->regs_read_count = '\x01';
      }
      goto LAB_00243d4d;
    }
  }
  else {
    if ((uVar11 - 0x26e < 0x39) &&
       ((0x1e000000000000dU >> ((ulong)(uVar11 - 0x26e) & 0x3f) & 1) != 0)) {
      if (h->mode == CS_MODE_64) {
        pcVar13 = insn->detail;
        if ((ulong)pcVar13->regs_read_count != 0) {
          uVar14 = 0;
          do {
            if (pcVar13->regs_read[uVar14] == 0x17) {
              pcVar13->regs_read[uVar14] = 0x27;
              break;
            }
            uVar14 = uVar14 + 1;
          } while (pcVar13->regs_read_count != uVar14);
        }
        if ((ulong)pcVar13->regs_write_count != 0) {
          uVar14 = 0;
          do {
            if (pcVar13->regs_write[uVar14] == 0x17) {
              pcVar13->regs_write[uVar14] = 0x27;
              break;
            }
            uVar14 = uVar14 + 1;
          } while (pcVar13->regs_write_count != uVar14);
        }
      }
      else if (h->mode == CS_MODE_16) {
        pcVar13 = insn->detail;
        if ((ulong)pcVar13->regs_read_count != 0) {
          uVar14 = 0;
          do {
            if (pcVar13->regs_read[uVar14] == 0x17) {
              pcVar13->regs_read[uVar14] = 0xe;
              break;
            }
            uVar14 = uVar14 + 1;
          } while (pcVar13->regs_read_count != uVar14);
        }
        if ((ulong)pcVar13->regs_write_count != 0) {
          uVar14 = 0;
          do {
            if (pcVar13->regs_write[uVar14] == 0x17) {
              pcVar13->regs_write[uVar14] = 0xe;
              break;
            }
            uVar14 = uVar14 + 1;
          } while (pcVar13->regs_write_count != uVar14);
        }
      }
      goto LAB_00243d4d;
    }
    if (((6 < uVar11 - 0x1d6) || ((0x53U >> (uVar11 - 0x1d6 & 0x1f) & 1) == 0)) && (uVar11 != 0x53b)
       ) goto LAB_00243d4d;
  }
  if (h->mode == CS_MODE_64) {
    pcVar13 = insn->detail;
    uVar14 = (ulong)pcVar13->regs_read_count;
    if (uVar14 != 0) {
      uVar15 = 0;
      do {
        if (pcVar13->regs_read[uVar15] == 0x17) {
          pcVar13->regs_read[uVar15] = 0x27;
          break;
        }
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    uVar15 = (ulong)pcVar13->regs_write_count;
    if (uVar15 != 0) {
      uVar16 = 0;
      do {
        if (pcVar13->regs_write[uVar16] == 0x17) {
          pcVar13->regs_write[uVar16] = 0x27;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    if (uVar14 != 0) {
      uVar16 = 0;
      do {
        if (pcVar13->regs_read[uVar16] == 0x1d) {
          pcVar13->regs_read[uVar16] = 0x2b;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (uVar14 != uVar16);
    }
    if (uVar15 != 0) {
      uVar14 = 0;
      do {
        if (pcVar13->regs_write[uVar14] == 0x1d) {
          pcVar13->regs_write[uVar14] = 0x2b;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
  }
  else if (h->mode == CS_MODE_16) {
    pcVar13 = insn->detail;
    uVar14 = (ulong)pcVar13->regs_read_count;
    if (uVar14 != 0) {
      uVar15 = 0;
      do {
        if (pcVar13->regs_read[uVar15] == 0x17) {
          pcVar13->regs_read[uVar15] = 0xe;
          break;
        }
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    uVar15 = (ulong)pcVar13->regs_write_count;
    if (uVar15 != 0) {
      uVar16 = 0;
      do {
        if (pcVar13->regs_write[uVar16] == 0x17) {
          pcVar13->regs_write[uVar16] = 0xe;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    if (uVar14 != 0) {
      uVar16 = 0;
      do {
        if (pcVar13->regs_read[uVar16] == 0x1d) {
          pcVar13->regs_read[uVar16] = 0x2d;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (uVar14 != uVar16);
    }
    if (uVar15 != 0) {
      uVar14 = 0;
      do {
        if (pcVar13->regs_write[uVar14] == 0x1d) {
          pcVar13->regs_write[uVar14] = 0x2d;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
  }
LAB_00243d4d:
  *(undefined8 *)insn->detail->groups = *(undefined8 *)insns[uVar9].groups;
  uVar11 = count_positive8(insns[uVar9].groups);
  pcVar13 = insn->detail;
  pcVar13->groups_count = (uint8_t)uVar11;
  if ((insns[uVar9].branch != false) || (insns[uVar9].indirect_branch == true)) {
    pcVar13->groups[uVar11 & 0xff] = '\x01';
    puVar1 = &insn->detail->groups_count;
    *puVar1 = *puVar1 + '\x01';
  }
  uVar11 = insns[uVar9].id - 0x78a;
  if (((uVar11 < 5) && ((0x15U >> (uVar11 & 0x1f) & 1) != 0)) &&
     (pcVar13 = insn->detail, paVar7 = &pcVar13->field_6,
     lVar3._0_4_ = ((cs_m68k_op *)paVar7)[1].mem.out_disp,
     lVar3._4_2_ = ((cs_m68k_op *)paVar7)[1].mem.disp,
     lVar3._6_1_ = ((cs_m68k_op *)paVar7)[1].mem.scale,
     lVar3._7_1_ = ((cs_m68k_op *)paVar7)[1].mem.bitfield, lVar3 == -0x4e)) {
    pcVar13->groups[pcVar13->groups_count] = '\x04';
    puVar1 = &insn->detail->groups_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

void X86_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			// special cases when regs_write[] depends on arch
			switch(id) {
				default:
					memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
					insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					break;
				case X86_RDTSC:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_EDX;
						insn->detail->regs_write_count = 2;
					}
					break;
				case X86_RDTSCP:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_ECX;
						insn->detail->regs_write[2] = X86_REG_EDX;
						insn->detail->regs_write_count = 3;
					}
					break;
			}

			switch(insn->id) {
				default:
					break;

				case X86_INS_LOOP:
				case X86_INS_LOOPE:
				case X86_INS_LOOPNE:
					switch(h->mode) {
						default: break;
						case CS_MODE_16:
								 insn->detail->regs_read[0] = X86_REG_CX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_CX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_32:
								 insn->detail->regs_read[0] = X86_REG_ECX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_ECX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_64:
								 insn->detail->regs_read[0] = X86_REG_RCX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_RCX;
								 insn->detail->regs_write_count = 1;
								 break;
					}

					// LOOPE & LOOPNE also read EFLAGS
					if (insn->id != X86_INS_LOOP) {
						insn->detail->regs_read[1] = X86_REG_EFLAGS;
						insn->detail->regs_read_count = 2;
					}

					break;

				case X86_INS_LODSB:
				case X86_INS_LODSD:
				case X86_INS_LODSQ:
				case X86_INS_LODSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;

				case X86_INS_SCASB:
				case X86_INS_SCASW:
				case X86_INS_SCASQ:
				case X86_INS_STOSB:
				case X86_INS_STOSD:
				case X86_INS_STOSQ:
				case X86_INS_STOSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							break;
					}
					break;

				case X86_INS_CMPSB:
				case X86_INS_CMPSD:
				case X86_INS_CMPSQ:
				case X86_INS_CMPSW:
				case X86_INS_MOVSB:
				case X86_INS_MOVSW:
				case X86_INS_MOVSD:
				case X86_INS_MOVSQ:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;

				case X86_INS_RET:
					switch(h->mode) {
						case CS_MODE_16:
							insn->detail->regs_write[0] = X86_REG_SP;
							insn->detail->regs_read[0] = X86_REG_SP;
							break;
						case CS_MODE_32:
							insn->detail->regs_write[0] = X86_REG_ESP;
							insn->detail->regs_read[0] = X86_REG_ESP;
							break;
						default:	// 64-bit
							insn->detail->regs_write[0] = X86_REG_RSP;
							insn->detail->regs_read[0] = X86_REG_RSP;
							break;
					}
					insn->detail->regs_write_count = 1;
					insn->detail->regs_read_count = 1;
					break;
			}

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = X86_GRP_JUMP;
				insn->detail->groups_count++;
			}

			switch (insns[i].id) {
				case X86_OUT8ir:
				case X86_OUT16ir:
				case X86_OUT32ir:
					if (insn->detail->x86.operands[0].imm == -78) {
						// Writing to port 0xb2 causes an SMI on most platforms
						// See: http://cs.gmu.edu/~tr-admin/papers/GMU-CS-TR-2011-8.pdf
						insn->detail->groups[insn->detail->groups_count] = X86_GRP_INT;
						insn->detail->groups_count++;
					}
					break;

				default:
					break;
			}
#endif
		}
	}
}